

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O3

void * matras_touch(matras *m,matras_id_t id)

{
  byte bVar1;
  matras_view *pmVar2;
  size_t sVar3;
  void *pvVar4;
  
  if ((m->head).block_count <= (ulong)id) {
    __assert_fail("id < m->head.block_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0x1fe,"void *matras_touch(struct matras *, matras_id_t)");
  }
  pmVar2 = (m->head).prev_view;
  if (((pmVar2 != (matras_view *)0x0) && (sVar3 = pmVar2->block_count, sVar3 != 0)) &&
     (bVar1 = (byte)m->shift2, id >> (bVar1 & 0x1f) <= (int)sVar3 - 1U >> (bVar1 & 0x1f))) {
    pvVar4 = matras_touch_no_check(m,id);
    return pvVar4;
  }
  return (void *)((ulong)((id & m->mask2) * m->block_size) +
                 *(long *)(*(long *)((long)(m->head).root +
                                    (ulong)(id >> ((byte)m->shift1 & 0x1f)) * 8) +
                          (ulong)((m->mask1 & id) >> ((byte)m->shift2 & 0x1f)) * 8));
}

Assistant:

void *
matras_touch(struct matras *m, matras_id_t id)
{
	assert(id < m->head.block_count);

	if (!matras_needs_touch(m, id))
		return matras_get(m, id);

	return matras_touch_no_check(m, id);
}